

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pod_vector.h
# Opt level: O2

void __thiscall Clasp::Assignment::undoLast(Assignment *this)

{
  size_type *psVar1;
  
  *(undefined4 *)
   ((long)(this->assign_).ebo_.buf +
   (ulong)((this->trail).ebo_.buf[(this->trail).ebo_.size - 1].rep_ & 0xfffffffc)) = 0;
  psVar1 = &(this->trail).ebo_.size;
  *psVar1 = *psVar1 - 1;
  return;
}

Assistant:

reference back() { assert(!empty()); return ebo_.buf[ebo_.size-1]; }